

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator::GenerateInterfaceMembers
          (RepeatedImmutableStringFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  Options *pOVar3;
  string_view local_1a8;
  Options local_198;
  string_view local_148;
  Options local_138;
  string_view local_e8;
  Options local_d8;
  string_view local_88 [2];
  Options local_68;
  Printer *local_18;
  Printer *printer_local;
  RepeatedImmutableStringFieldGenerator *this_local;
  
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  local_18 = printer;
  printer_local = (Printer *)this;
  pOVar3 = Context::options((this->super_ImmutableStringFieldGenerator).context_);
  java::Options::Options(&local_68,pOVar3);
  WriteFieldAccessorDocComment(printer,pFVar1,LIST_GETTER,&local_68,false,false);
  java::Options::~Options(&local_68);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_88,
             "$deprecation$java.util.List<java.lang.String>\n    get$capitalized_name$List();\n");
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_88[0]);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutableStringFieldGenerator).context_);
  java::Options::Options(&local_d8,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_COUNT,&local_d8,false,false);
  java::Options::~Options(&local_d8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e8,"$deprecation$int get$capitalized_name$Count();\n");
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_e8);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutableStringFieldGenerator).context_);
  java::Options::Options(&local_138,pOVar3);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_GETTER,&local_138,false,false);
  java::Options::~Options(&local_138);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_148,"$deprecation$java.lang.String get$capitalized_name$(int index);\n");
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_148);
  pPVar2 = local_18;
  pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
  pOVar3 = Context::options((this->super_ImmutableStringFieldGenerator).context_);
  java::Options::Options(&local_198,pOVar3);
  WriteFieldStringBytesAccessorDocComment(pPVar2,pFVar1,LIST_INDEXED_GETTER,&local_198,false,false);
  java::Options::~Options(&local_198);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a8,
             "$deprecation$com.google.protobuf.ByteString\n    get$capitalized_name$Bytes(int index);\n"
            );
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&(this->super_ImmutableStringFieldGenerator).variables_,local_1a8);
  return;
}

Assistant:

void RepeatedImmutableStringFieldGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER,
                               context_->options());
  printer->Print(
      variables_,
      // NOTE: the same method in the implementation class actually returns
      // com.google.protobuf.ProtocolStringList (a subclass of List). It's
      // changed between protobuf 2.5.0 release and protobuf 2.6.1 release.
      // To retain binary compatibility with both 2.5.0 and 2.6.1 generated
      // code, we make this interface method return List so both methods
      // with different return types exist in the compiled byte code.
      "$deprecation$java.util.List<java.lang.String>\n"
      "    get$capitalized_name$List();\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$int get$capitalized_name$Count();\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "$deprecation$java.lang.String get$capitalized_name$(int index);\n");
  WriteFieldStringBytesAccessorDocComment(
      printer, descriptor_, LIST_INDEXED_GETTER, context_->options());
  printer->Print(variables_,
                 "$deprecation$com.google.protobuf.ByteString\n"
                 "    get$capitalized_name$Bytes(int index);\n");
}